

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

void __thiscall CFG::eliminateNonGeneratingSymbols(CFG *this)

{
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  pointer ppPVar5;
  ulong uVar6;
  char *this_00;
  pointer __src;
  CFG *this_01;
  int iVar7;
  pointer ppPVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generatingSymbols;
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  
  local_a0 = &this->terminalsT;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,local_a0);
  do {
    bVar2 = expandGeneratingSymbols(this,&local_98);
  } while (bVar2);
  this_00 = "Generating symbols: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating symbols: ",0x14);
  vecToStr(&local_80,(CFG *)this_00,&local_98);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = (this->nonTerminalsV).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nonTerminalsV).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    uVar6 = 0;
    iVar7 = 0;
    do {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar1 = pbVar4[uVar6]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar1,pcVar1 + pbVar4[uVar6]._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffffb8,&local_98);
      bVar2 = inVector(&local_c0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffffb8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&this->nonTerminalsV,
                   (this->nonTerminalsV).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar6);
        iVar7 = iVar7 + -1;
      }
      iVar7 = iVar7 + 1;
      uVar6 = (ulong)iVar7;
      pbVar4 = (this->nonTerminalsV).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->nonTerminalsV).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5));
  }
  ppPVar8 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar8) {
    uVar6 = 0;
    iVar7 = 0;
    do {
      this_01 = (CFG *)&stack0xffffffffffffffa0;
      vectorUnion((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffa0,local_a0,&local_98);
      bVar2 = reachableProduction(this_01,ppPVar8 + uVar6,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&stack0xffffffffffffffa0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffffa0);
      ppPVar8 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppPVar5 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar2) {
        __src = ppPVar8 + uVar6 + 1;
        if (__src != ppPVar5) {
          memmove(ppPVar8 + uVar6,__src,(long)ppPVar5 - (long)__src);
          ppPVar8 = (this->productionsP).
                    super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppPVar5 = (this->productionsP).
                    super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        ppPVar5 = ppPVar5 + -1;
        (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl
        .super__Vector_impl_data._M_finish = ppPVar5;
        iVar7 = iVar7 + -1;
      }
      iVar7 = iVar7 + 1;
      uVar6 = (ulong)iVar7;
    } while (uVar6 < (ulong)((long)ppPVar5 - (long)ppPVar8 >> 3));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void CFG::eliminateNonGeneratingSymbols() {
    // Find all generating symbols (and thus also the nongenerating)
    std::vector<std::string> generatingSymbols = terminalsT;

    while (expandGeneratingSymbols(generatingSymbols)) {}

    std::cout << "Generating symbols: " << vecToStr(generatingSymbols) << std::endl;

    // Remove all non-generating symbols from variables, (terminals) and productions
    for (int i = 0; i < nonTerminalsV.size(); ++i) {
        if (!inVector(nonTerminalsV[i], generatingSymbols)) {
            nonTerminalsV.erase(nonTerminalsV.begin() + i);
            --i;
        }
    }

    for (int j = 0; j < productionsP.size(); ++j) {
        if (!reachableProduction(productionsP[j], vectorUnion(terminalsT, generatingSymbols))) {
            productionsP.erase(productionsP.begin() + j);
            --j;
        }
    }

}